

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpivotL.c
# Opt level: O2

int dpivotL(int jcol,double u,int *usepr,int *perm_r,int *iperm_r,int *iperm_c,int *pivrow,
           GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int_t iVar4;
  flops_t *pfVar5;
  void *pvVar6;
  int_t *piVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  
  pfVar5 = stat->ops;
  pvVar6 = Glu->lusup;
  iVar2 = Glu->xsup[Glu->supno[jcol]];
  iVar11 = jcol - iVar2;
  iVar13 = Glu->xlsub[iVar2];
  iVar10 = Glu->xlsub[(long)iVar2 + 1] - iVar13;
  iVar2 = Glu->xlusup[iVar2];
  iVar3 = Glu->xlusup[jcol];
  piVar7 = Glu->lsub;
  if (*usepr != 0) {
    *pivrow = iperm_r[jcol];
  }
  uVar16 = 0xffffffff;
  uVar9 = (ulong)iVar11;
  iVar12 = iVar11;
  iVar15 = iVar11;
  dVar17 = 0.0;
  for (uVar14 = uVar9; (long)uVar14 < (long)iVar10; uVar14 = uVar14 + 1) {
    dVar18 = ABS(*(double *)((long)pvVar6 + uVar14 * 8 + (long)iVar3 * 8));
    if (dVar17 < dVar18) {
      iVar12 = (int)uVar14;
    }
    if ((*usepr != 0) && (piVar7[(long)iVar13 + uVar14] == *pivrow)) {
      iVar15 = (int)uVar14;
    }
    if (dVar18 <= dVar17) {
      dVar18 = dVar17;
    }
    if (piVar7[(long)iVar13 + uVar14] == iperm_c[jcol]) {
      uVar16 = uVar14 & 0xffffffff;
    }
    dVar17 = dVar18;
  }
  if ((dVar17 == 0.0) && (!NAN(dVar17))) {
    *usepr = 0;
    return jcol + 1;
  }
  if (*usepr != 0) {
    dVar18 = *(double *)((long)pvVar6 + (long)iVar15 * 8 + (long)iVar3 * 8);
    if (((dVar18 != 0.0) || (NAN(dVar18))) && (dVar17 * u <= ABS(dVar18))) {
      iVar12 = *pivrow;
      goto LAB_0010638c;
    }
    *usepr = 0;
  }
  iVar15 = iVar12;
  if ((-1 < (int)uVar16) &&
     (dVar18 = *(double *)((long)pvVar6 + uVar16 * 8 + (long)iVar3 * 8),
     dVar17 * u <= ABS(dVar18) && dVar18 != 0.0)) {
    iVar15 = (int)uVar16;
  }
  iVar12 = piVar7[(long)iVar13 + (long)iVar15];
  *pivrow = iVar12;
LAB_0010638c:
  perm_r[iVar12] = jcol;
  if (iVar15 != iVar11) {
    iVar4 = piVar7[(long)iVar13 + (long)iVar15];
    piVar7[(long)iVar13 + (long)iVar15] = piVar7[(long)iVar13 + uVar9];
    piVar7[(long)iVar13 + uVar9] = iVar4;
    iVar13 = iVar11;
    for (lVar8 = 0; lVar8 <= (long)uVar9; lVar8 = lVar8 + 1) {
      uVar1 = *(undefined8 *)((long)pvVar6 + (long)iVar15 * 8 + (long)iVar2 * 8);
      *(undefined8 *)((long)pvVar6 + (long)iVar15 * 8 + (long)iVar2 * 8) =
           *(undefined8 *)((long)pvVar6 + (long)iVar13 * 8 + (long)iVar2 * 8);
      *(undefined8 *)((long)pvVar6 + (long)iVar13 * 8 + (long)iVar2 * 8) = uVar1;
      iVar13 = iVar13 + iVar10;
      iVar15 = iVar15 + iVar10;
    }
  }
  pfVar5[7] = (float)(iVar10 - iVar11) + pfVar5[7];
  dVar17 = *(double *)((long)pvVar6 + uVar9 * 8 + (long)iVar3 * 8);
  while (uVar9 = uVar9 + 1, (long)uVar9 < (long)iVar10) {
    *(double *)((long)pvVar6 + uVar9 * 8 + (long)iVar3 * 8) =
         *(double *)((long)pvVar6 + uVar9 * 8 + (long)iVar3 * 8) * (1.0 / dVar17);
  }
  return 0;
}

Assistant:

int
dpivotL(
        const int  jcol,     /* in */
        const double u,      /* in - diagonal pivoting threshold */
        int        *usepr,   /* re-use the pivot sequence given by perm_r/iperm_r */
        int        *perm_r,  /* may be modified */
        int        *iperm_r, /* in - inverse of perm_r */
        int        *iperm_c, /* in - used to find diagonal of Pc*A*Pc' */
        int        *pivrow,  /* out */
        GlobalLU_t *Glu,     /* modified - global LU data structures */
	SuperLUStat_t *stat  /* output */
       )
{

    int          fsupc;	    /* first column in the supernode */
    int          nsupc;	    /* no of columns in the supernode */
    int          nsupr;     /* no of rows in the supernode */
    int_t        lptr;	    /* points to the starting subscript of the supernode */
    int          pivptr, old_pivptr, diag, diagind;
    double       pivmax, rtemp, thresh;
    double       temp;
    double       *lu_sup_ptr; 
    double       *lu_col_ptr;
    int_t        *lsub_ptr;
    int_t        isub, icol, k, itemp;
    int_t        *lsub, *xlsub;
    double       *lusup;
    int_t        *xlusup;
    flops_t      *ops = stat->ops;

    /* Initialize pointers */
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (double *) Glu->lusup;
    xlusup     = Glu->xlusup;
    fsupc      = (Glu->xsup)[(Glu->supno)[jcol]];
    nsupc      = jcol - fsupc;	        /* excluding jcol; nsupc >= 0 */
    lptr       = xlsub[fsupc];
    nsupr      = xlsub[fsupc+1] - lptr;
    lu_sup_ptr = &lusup[xlusup[fsupc]];	/* start of the current supernode */
    lu_col_ptr = &lusup[xlusup[jcol]];	/* start of jcol in the supernode */
    lsub_ptr   = &lsub[lptr];	/* start of row indices of the supernode */

#ifdef DEBUG
if ( jcol == MIN_COL ) {
    printf("Before cdiv: col %d\n", jcol);
    for (k = nsupc; k < nsupr; k++) 
	printf("  lu[%d] %f\n", lsub_ptr[k], lu_col_ptr[k]);
}
#endif
    
    /* Determine the largest abs numerical value for partial pivoting;
       Also search for user-specified pivot, and diagonal element. */
    if ( *usepr ) *pivrow = iperm_r[jcol];
    diagind = iperm_c[jcol];
    pivmax = 0.0;
    pivptr = nsupc;
    diag = SLU_EMPTY;
    old_pivptr = nsupc;
    for (isub = nsupc; isub < nsupr; ++isub) {
	rtemp = fabs (lu_col_ptr[isub]);
	if ( rtemp > pivmax ) {
	    pivmax = rtemp;
	    pivptr = isub;
	}
	if ( *usepr && lsub_ptr[isub] == *pivrow ) old_pivptr = isub;
	if ( lsub_ptr[isub] == diagind ) diag = isub;
    }

    /* Test for singularity */
    if ( pivmax == 0.0 ) {
#if 0
        // There is no valid pivot.
        // jcol represents the rank of U, 
        // report the rank, let dgstrf handle the pivot
	*pivrow = lsub_ptr[pivptr];
	perm_r[*pivrow] = jcol;
#endif
	*usepr = 0;
	return (jcol+1);
    }

    thresh = u * pivmax;
    
    /* Choose appropriate pivotal element by our policy. */
    if ( *usepr ) {
        rtemp = fabs (lu_col_ptr[old_pivptr]);
	if ( rtemp != 0.0 && rtemp >= thresh )
	    pivptr = old_pivptr;
	else
	    *usepr = 0;
    }
    if ( *usepr == 0 ) {
	/* Use diagonal pivot? */
	if ( diag >= 0 ) { /* diagonal exists */
	    rtemp = fabs (lu_col_ptr[diag]);
	    if ( rtemp != 0.0 && rtemp >= thresh ) pivptr = diag;
        }
	*pivrow = lsub_ptr[pivptr];
    }
    
    /* Record pivot row */
    perm_r[*pivrow] = jcol;
    
    /* Interchange row subscripts */
    if ( pivptr != nsupc ) {
	itemp = lsub_ptr[pivptr];
	lsub_ptr[pivptr] = lsub_ptr[nsupc];
	lsub_ptr[nsupc] = itemp;

	/* Interchange numerical values as well, for the whole snode, such 
	 * that L is indexed the same way as A.
 	 */
	for (icol = 0; icol <= nsupc; icol++) {
	    itemp = pivptr + icol * nsupr;
	    temp = lu_sup_ptr[itemp];
	    lu_sup_ptr[itemp] = lu_sup_ptr[nsupc + icol*nsupr];
	    lu_sup_ptr[nsupc + icol*nsupr] = temp;
	}
    } /* if */

    /* cdiv operation */
    ops[FACT] += nsupr - nsupc;

    temp = 1.0 / lu_col_ptr[nsupc];
    for (k = nsupc+1; k < nsupr; k++) 
	lu_col_ptr[k] *= temp;

    return 0;
}